

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_wizlock(CHAR_DATA *ch,char *argument)

{
  char *string;
  char *txt;
  
  string = "$N has wizlocked the game.";
  if (wizlock) {
    string = "$N removes wizlock.";
  }
  txt = "Game wizlocked.\n\r";
  if (wizlock) {
    txt = "Game un-wizlocked.\n\r";
  }
  wizlock = !wizlock;
  wiznet(string,ch,(OBJ_DATA *)0x0,0,0,0);
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_wizlock(CHAR_DATA *ch, char *argument)
{
	wizlock = !wizlock;

	if (wizlock)
	{
		wiznet("$N has wizlocked the game.", ch, nullptr, 0, 0, 0);
		send_to_char("Game wizlocked.\n\r", ch);
	}
	else
	{
		wiznet("$N removes wizlock.", ch, nullptr, 0, 0, 0);
		send_to_char("Game un-wizlocked.\n\r", ch);
	}
}